

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Section::~Section(Section *this)

{
  pointer pcVar1;
  char cVar2;
  IResultCapture *pIVar3;
  long lVar4;
  SectionEndInfo endInfo;
  SectionEndInfo local_98;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_00166ca0;
  if (this->m_sectionIncluded == true) {
    gettimeofday((timeval *)&local_98,(__timezone_ptr_t)0x0);
    SectionEndInfo::SectionEndInfo
              (&local_98,&this->m_info,&this->m_assertions,
               (double)(uint)(((int)local_98.sectionInfo.name._M_dataplus._M_p * 1000000 +
                              (int)local_98.sectionInfo.name._M_string_length) -
                             (int)(this->m_timer).m_ticks) / 1000000.0);
    cVar2 = std::uncaught_exception();
    if (cVar2 == '\0') {
      pIVar3 = getResultCapture();
      lVar4 = 0x20;
    }
    else {
      pIVar3 = getResultCapture();
      lVar4 = 0x28;
    }
    (**(code **)((long)pIVar3->_vptr_IResultCapture + lVar4))(pIVar3,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.sectionInfo.lineInfo.file._M_dataplus._M_p !=
        &local_98.sectionInfo.lineInfo.file.field_2) {
      operator_delete(local_98.sectionInfo.lineInfo.file._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.sectionInfo.description._M_dataplus._M_p !=
        &local_98.sectionInfo.description.field_2) {
      operator_delete(local_98.sectionInfo.description._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_98.sectionInfo.name._M_dataplus._M_p._4_4_,
                    (int)local_98.sectionInfo.name._M_dataplus._M_p) !=
        &local_98.sectionInfo.name.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_98.sectionInfo.name._M_dataplus._M_p._4_4_,
                               (int)local_98.sectionInfo.name._M_dataplus._M_p));
    }
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).lineInfo.file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).lineInfo.file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).description.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).name.field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo( m_info, m_assertions, m_timer.getElapsedSeconds() );
            if( std::uncaught_exception() )
                getResultCapture().sectionEndedEarly( endInfo );
            else
                getResultCapture().sectionEnded( endInfo );
        }
    }